

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O2

void soundfiler_read(t_soundfiler *x,t_symbol *s,int argc,t_atom *argv)

{
  float fVar1;
  char cVar2;
  t_word *ptVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  t_soundfile_type *ptVar7;
  _garray *p_Var8;
  _binbuf *b;
  t_atom *ptVar9;
  ulong uVar10;
  int *piVar11;
  ulong uVar12;
  ssize_t sVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  char *pcVar19;
  ulong uVar20;
  long lVar21;
  uint *__buf;
  uint *puVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  char *pcVar26;
  t_float tVar27;
  long lStack_8d0;
  size_t local_8b0;
  t_soundfile local_898;
  char *local_858;
  ulong local_850;
  int vecsize_2;
  undefined4 uStack_844;
  int local_840;
  int vecsize_3;
  t_word *vecs [64];
  _garray *garrays [64];
  char sampbuf [1024];
  
  local_898.sf_type = (t_soundfile_type *)0x0;
  local_898.sf_bigendian = 0;
  local_898.sf_bytesperframe = 0;
  local_898.sf_samplerate = 0;
  local_898.sf_nchannels = 0;
  local_898.sf_bytespersample = 0;
  local_898._28_4_ = 0;
  local_898.sf_fd = -1;
  local_898._4_4_ = 0;
  local_898.sf_bytelimit = 0x7fffffffffffffff;
  local_898.sf_headersize = -1;
  lVar23 = -1;
  ptVar7 = (t_soundfile_type *)0x0;
  local_8b0 = 0;
  local_850 = 0xffffffffffffffff;
  iVar17 = 0;
  iVar6 = 0;
  bVar4 = false;
  while (((0 < argc && (argv->a_type == A_SYMBOL)) &&
         (pcVar26 = ((argv->a_w).w_symbol)->s_name, *pcVar26 == '-'))) {
    pcVar26 = pcVar26 + 1;
    pcVar19 = "skip";
    iVar5 = strcmp(pcVar26,"skip");
    if (iVar5 == 0) {
      if (((argc == 1) || (argv[1].a_type != A_FLOAT)) || (fVar1 = argv[1].a_w.w_float, fVar1 < 0.0)
         ) goto LAB_00128049;
      local_8b0 = (long)(fVar1 - 9.223372e+18) & (long)fVar1 >> 0x3f | (long)fVar1;
      iVar5 = -2;
      lStack_8d0 = 0x20;
    }
    else {
      pcVar19 = "ascii";
      iVar5 = strcmp(pcVar26,"ascii");
      if (iVar5 == 0) {
        if (-1 < lVar23) {
          post("\'-ascii\' overridden by \'-raw\'");
        }
        iVar5 = -1;
        lStack_8d0 = 0x10;
        iVar6 = 1;
      }
      else {
        pcVar19 = "raw";
        iVar5 = strcmp(pcVar26,"raw");
        if (iVar5 == 0) {
          if (iVar6 == 0) {
            if (ptVar7 != (t_soundfile_type *)0x0) {
              pcVar19 = ptVar7->t_name;
              post("\'-%s\' overridden by \'-raw\'");
            }
          }
          else {
            post("\'-ascii\' overridden by \'-raw\'");
          }
          if ((((uint)argc < 5) || (argv[1].a_type != A_FLOAT)) ||
             ((lVar23 = (long)argv[1].a_w.w_float, local_898.sf_headersize = lVar23, lVar23 < 0 ||
              (((argv[2].a_type != A_FLOAT ||
                (uVar25 = (uint)argv[2].a_w.w_float, local_898.sf_nchannels = uVar25,
                uVar25 - 0x41 < 0xffffffc0)) || (argv[3].a_type != A_FLOAT)))))) goto LAB_00128049;
          iVar17 = (int)argv[3].a_w.w_float;
          local_898.sf_bytespersample = iVar17;
          if ((iVar17 - 5U < 0xfffffffd) || (argv[4].a_type != A_SYMBOL)) goto LAB_00128049;
          cVar2 = *(argv[4].a_w.w_symbol)->s_name;
          iVar5 = 1;
          if (cVar2 != 'b') {
            if ((cVar2 != 'n') && (cVar2 != 'l')) goto LAB_00128049;
            iVar5 = 0;
          }
          local_898.sf_bigendian = iVar5;
          tVar27 = sys_getsr();
          local_898.sf_samplerate = (int)tVar27;
          local_898.sf_bytesperframe = iVar17 * uVar25;
          iVar5 = -5;
          lStack_8d0 = 0x50;
          iVar17 = 1;
        }
        else {
          pcVar19 = "resize";
          iVar5 = strcmp(pcVar26,"resize");
          if (iVar5 == 0) {
            iVar5 = -1;
            lStack_8d0 = 0x10;
            bVar4 = true;
          }
          else {
            pcVar19 = "maxsize";
            iVar5 = strcmp(pcVar26,"maxsize");
            if (iVar5 == 0) {
              if ((argc == 1) || (argv[1].a_type != A_FLOAT)) goto LAB_00128049;
              local_850 = (ulong)argv[1].a_w.w_float;
              iVar5 = -2;
              lStack_8d0 = 0x20;
              pcVar19 = (char *)0x1;
              bVar4 = true;
              if ((long)local_850 < 0) goto LAB_00128049;
            }
            else {
              ptVar7 = soundfile_findtype(pcVar26);
              local_898.sf_type = ptVar7;
              if (ptVar7 == (t_soundfile_type *)0x0) goto LAB_00128049;
              if (-1 < lVar23) {
                pcVar19 = ptVar7->t_name;
                post("\'-%s\' overridden by \'-raw\'");
              }
              iVar6 = 0;
              iVar5 = -1;
              lStack_8d0 = 0x10;
            }
          }
        }
      }
    }
    argc = argc + iVar5;
    argv = (t_atom *)((long)&argv->a_type + lStack_8d0);
    s = (t_symbol *)pcVar19;
  }
  if (-1 < lVar23) {
    local_898.sf_type = (t_soundfile_type *)0x0;
    ptVar7 = (t_soundfile_type *)0x0;
    iVar6 = 0;
  }
  if ((argc - 0x42U < 0xffffffbf) || (argv->a_type != A_SYMBOL)) {
LAB_00128049:
    uVar15 = 0;
    pd_error(x,"usage: read [flags] filename [tablename]...");
    post("flags: -skip <n> -resize -maxsize <n> %s -ascii ...",sf_typeargs);
    post("-raw <headerbytes> <channels> <bytespersample> <endian (b, l, or n)>");
  }
  else {
    pcVar26 = ((argv->a_w).w_symbol)->s_name;
    uVar25 = argc - 1;
    local_840 = iVar17;
    if ((lVar23 < 0) && ((iVar6 == 0 && (ptVar7 == (t_soundfile_type *)0x0)))) {
      iVar6 = ascii_hasextension(pcVar26,(size_t)s);
    }
    uVar16 = (ulong)uVar25;
    uVar18 = 0;
    local_858 = pcVar26;
    for (lVar23 = 0; pcVar26 = local_858, uVar16 * 8 - lVar23 != 0; lVar23 = lVar23 + 8) {
      if (*(int *)((long)&argv[1].a_type + lVar23 * 2) != 2) goto LAB_00128049;
      p_Var8 = (_garray *)
               pd_findbyclass(*(t_symbol **)((long)&argv[1].a_w + lVar23 * 2),garray_class);
      *(_garray **)((long)garrays + lVar23) = p_Var8;
      if (p_Var8 == (_garray *)0x0) {
        uVar15 = 0;
        pd_error(x,"soundfiler read: %s: no such table",
                 **(undefined8 **)((long)&argv[1].a_w + lVar23 * 2));
        goto LAB_00128085;
      }
      iVar17 = garray_getfloatwords(p_Var8,(int *)sampbuf,(t_word **)((long)vecs + lVar23));
      if (iVar17 == 0) {
        pd_error(x,"soundfiler read: %s: bad template for tabwrite",
                 **(undefined8 **)((long)&argv[1].a_w + lVar23 * 2));
      }
      if ((uVar18 != 0) && (!bVar4 && uVar18 != (long)(int)sampbuf._0_4_)) {
        post("arrays have different lengths, resizing...");
        bVar4 = true;
      }
      uVar18 = (ulong)(int)sampbuf._0_4_;
    }
    if (iVar6 == 0) {
      iVar17 = open_soundfile_via_canvas(x->x_canvas,local_858,&local_898,local_8b0);
      uVar15 = local_850;
      if (-1 < iVar17) {
        uVar10 = local_898.sf_bytelimit / (long)local_898.sf_bytesperframe;
        if (bVar4) {
          uVar18 = uVar10;
          if (local_850 < uVar10) {
            pd_error(x,"soundfiler read: truncated to %ld elements",local_850);
            uVar18 = uVar15;
          }
          for (lVar23 = 0; uVar10 = uVar18, uVar16 * 8 - lVar23 != 0; lVar23 = lVar23 + 8) {
            p_Var8 = *(_garray **)((long)garrays + lVar23);
            garray_resize_long(p_Var8,uVar18);
            garray_setsaveit(p_Var8,0);
            iVar6 = garray_getfloatwords(p_Var8,(int *)sampbuf,(t_word **)((long)vecs + lVar23));
            if ((iVar6 == 0) || (uVar18 != (long)(int)sampbuf._0_4_)) {
              pd_error(x,"soundfiler read: resize failed");
              uVar15 = 0;
              goto LAB_0012873b;
            }
          }
        }
        uVar18 = -(ulong)(uVar18 == 0) | uVar18;
        uVar15 = uVar10;
        if (uVar18 < uVar10) {
          uVar15 = uVar18;
        }
        if ((long)uVar10 < 0) {
          uVar15 = uVar18;
        }
        if (((uVar25 != 0) || (local_840 != 0)) || (uVar15 == 0xffffffffffffffff)) {
          uVar18 = (ulong)(int)(0x400 / (long)local_898.sf_bytesperframe);
          for (uVar10 = 0; uVar12 = uVar15 - uVar10, uVar10 <= uVar15 && uVar12 != 0;
              uVar10 = uVar10 + lVar23) {
            if (uVar18 <= uVar12) {
              uVar12 = uVar18;
            }
            __buf = (uint *)sampbuf;
            sVar13 = read(local_898.sf_fd,__buf,(long)local_898.sf_bytesperframe * uVar12);
            lVar23 = sVar13 / (long)local_898.sf_bytesperframe;
            if (lVar23 < 1) {
              if ((bVar4) && (uVar10 < uVar15)) {
                post("warning: soundfile %s header promised %ld points but file was truncated to %ld"
                     ,local_858,uVar15,uVar10);
              }
              break;
            }
            uVar14 = local_898.sf_nchannels;
            if ((int)uVar25 <= local_898.sf_nchannels) {
              uVar14 = uVar25;
            }
            uVar12 = (ulong)uVar14;
            if ((int)uVar14 < 1) {
              uVar12 = 0;
            }
            for (uVar20 = 0; uVar20 != uVar12; uVar20 = uVar20 + 1) {
              if (local_898.sf_bytespersample == 4) {
                ptVar3 = vecs[uVar20];
                if (local_898.sf_bigendian == 0) {
                  puVar22 = __buf;
                  for (lVar24 = 0; lVar23 != lVar24; lVar24 = lVar24 + 1) {
                    ptVar3[uVar10 + lVar24].w_index = *puVar22;
                    puVar22 = (uint *)((long)puVar22 + (long)local_898.sf_bytesperframe);
                  }
                }
                else {
                  puVar22 = __buf;
                  for (lVar24 = 0; lVar23 != lVar24; lVar24 = lVar24 + 1) {
                    uVar14 = *puVar22;
                    ptVar3[uVar10 + lVar24].w_index =
                         uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                         uVar14 << 0x18;
                    puVar22 = (uint *)((long)puVar22 + (long)local_898.sf_bytesperframe);
                  }
                }
              }
              else if (local_898.sf_bytespersample == 3) {
                ptVar3 = vecs[uVar20];
                if (local_898.sf_bigendian == 0) {
                  puVar22 = __buf;
                  for (lVar24 = 0; lVar23 != lVar24; lVar24 = lVar24 + 1) {
                    ptVar3[uVar10 + lVar24].w_float =
                         (float)(int)((uint)(byte)*puVar22 << 8 |
                                     (uint)*(ushort *)((long)puVar22 + 1) << 0x10) * 4.656613e-10;
                    puVar22 = (uint *)((long)puVar22 + (long)local_898.sf_bytesperframe);
                  }
                }
                else {
                  puVar22 = __buf;
                  for (lVar24 = 0; lVar23 != lVar24; lVar24 = lVar24 + 1) {
                    ptVar3[uVar10 + lVar24].w_float =
                         (float)(int)((uint)*(byte *)((long)puVar22 + 2) << 8 |
                                     (uint)*(byte *)((long)puVar22 + 1) << 0x10 |
                                     (uint)(byte)*puVar22 << 0x18) * 4.656613e-10;
                    puVar22 = (uint *)((long)puVar22 + (long)local_898.sf_bytesperframe);
                  }
                }
              }
              else if (local_898.sf_bytespersample == 2) {
                ptVar3 = vecs[uVar20];
                if (local_898.sf_bigendian == 0) {
                  puVar22 = __buf;
                  for (lVar24 = 0; lVar23 != lVar24; lVar24 = lVar24 + 1) {
                    ptVar3[uVar10 + lVar24].w_float =
                         (float)(int)((uint)(ushort)*puVar22 << 0x10) * 4.656613e-10;
                    puVar22 = (uint *)((long)puVar22 + (long)local_898.sf_bytesperframe);
                  }
                }
                else {
                  puVar22 = __buf;
                  for (lVar24 = 0; lVar23 != lVar24; lVar24 = lVar24 + 1) {
                    ptVar3[uVar10 + lVar24].w_float =
                         (float)(int)((uint)*(byte *)((long)puVar22 + 1) << 0x10 |
                                     (uint)(byte)*puVar22 << 0x18) * 4.656613e-10;
                    puVar22 = (uint *)((long)puVar22 + (long)local_898.sf_bytesperframe);
                  }
                }
              }
              __buf = (uint *)((long)__buf + (long)local_898.sf_bytespersample);
            }
            for (lVar24 = (long)local_898.sf_nchannels; lVar24 < (int)uVar25; lVar24 = lVar24 + 1) {
              ptVar3 = vecs[lVar24];
              for (lVar21 = 0; lVar23 != lVar21; lVar21 = lVar21 + 1) {
                ptVar3[lVar21].w_float = 0.0;
              }
            }
          }
          for (uVar18 = 0; uVar18 != uVar16; uVar18 = uVar18 + 1) {
            iVar6 = garray_getfloatwords(garrays[uVar18],&vecsize_2,vecs + uVar18);
            uVar15 = uVar10;
            if (iVar6 != 0) {
              for (; uVar15 < (ulong)(long)vecsize_2; uVar15 = uVar15 + 1) {
                vecs[uVar18][uVar15].w_float = 0.0;
              }
            }
          }
          for (lVar23 = (long)local_898.sf_nchannels; lVar23 < (int)uVar25; lVar23 = lVar23 + 1) {
            iVar6 = garray_getfloatwords(garrays[lVar23],&vecsize_3,(t_word **)&vecsize_2);
            if (iVar6 != 0) {
              for (uVar18 = 0; uVar18 < (ulong)(long)vecsize_3; uVar18 = uVar18 + 1) {
                *(undefined4 *)(CONCAT44(uStack_844,vecsize_2) + uVar18 * 8) = 0;
              }
            }
          }
          for (uVar18 = 0; uVar15 = uVar10, uVar16 != uVar18; uVar18 = uVar18 + 1) {
            garray_redraw(garrays[uVar18]);
          }
        }
LAB_0012873b:
        local_898.sf_fd = -1;
        sys_close(iVar17);
        goto LAB_0012808a;
      }
      piVar11 = __errno_location();
      object_sferror(x,"soundfiler read",pcVar26,*piVar11,&local_898);
      uVar15 = 0;
    }
    else if (uVar25 == 0) {
      uVar15 = 0;
      pd_error(x,"soundfiler read: \'-ascii\' requires at least one table");
    }
    else {
      b = binbuf_new();
      pcVar26 = local_858;
      iVar6 = binbuf_read_via_canvas(b,local_858,x->x_canvas,0);
      iVar17 = 0;
      if (iVar6 == 0) {
        ptVar9 = binbuf_getvec(b);
        iVar17 = binbuf_getnatom(b);
        uVar16 = local_850;
        if (iVar17 / (int)uVar25 < 1) {
          pd_error(x,"soundfiler read: %s: empty or very short ascii file",pcVar26);
        }
        else {
          uVar15 = (ulong)(iVar17 / (int)uVar25);
          if (!bVar4) {
            uVar16 = uVar15 - local_8b0;
            if ((long)uVar18 <= (long)uVar15) {
              uVar16 = uVar18;
            }
            lVar23 = 0;
            if (0 < (long)(int)uVar25) {
              lVar23 = (long)(int)uVar25;
            }
LAB_0012877b:
            uVar15 = 0;
            uVar18 = (long)(int)uVar25 * local_8b0;
            if ((long)local_8b0 < 1) {
              uVar18 = uVar15;
            }
            ptVar9 = ptVar9 + uVar18;
            uVar18 = 0;
            if (0 < (long)uVar16) {
              uVar18 = uVar16;
            }
            for (; uVar15 != uVar18; uVar15 = uVar15 + 1) {
              for (lVar24 = 0; lVar23 != lVar24; lVar24 = lVar24 + 1) {
                tVar27 = atom_getfloat(ptVar9);
                vecs[lVar24][uVar15].w_float = tVar27;
                ptVar9 = ptVar9 + 1;
              }
            }
            local_8b0._0_4_ = (int)uVar16;
            for (lVar24 = 0; lVar24 != lVar23; lVar24 = lVar24 + 1) {
              iVar17 = garray_getfloatwords(garrays[lVar24],(int *)sampbuf,vecs + lVar24);
              lVar21 = (long)(int)local_8b0;
              if (iVar17 != 0) {
                for (; lVar21 < (int)sampbuf._0_4_; lVar21 = lVar21 + 1) {
                  vecs[lVar24][lVar21].w_float = 0.0;
                }
              }
            }
            for (lVar24 = 0; iVar17 = (int)local_8b0, lVar23 != lVar24; lVar24 = lVar24 + 1) {
              garray_redraw(garrays[lVar24]);
            }
            goto LAB_00128856;
          }
          if (local_850 < uVar15) {
            pd_error(x,"soundfiler read: truncated to %ld elements",local_850);
            uVar15 = uVar16;
          }
          uVar16 = uVar15 - local_8b0;
          lVar24 = 0;
          lVar23 = 0;
          if (0 < (long)(int)uVar25) {
            lVar23 = (long)(int)uVar25;
          }
          do {
            if (lVar23 * 8 == lVar24) goto LAB_0012877b;
            p_Var8 = *(_garray **)((long)garrays + lVar24);
            garray_resize_long(p_Var8,uVar16);
            garray_setsaveit(p_Var8,0);
            iVar17 = garray_getfloatwords(p_Var8,(int *)sampbuf,(t_word **)((long)vecs + lVar24));
          } while ((iVar17 != 0) && (lVar24 = lVar24 + 8, uVar16 == (long)(int)sampbuf._0_4_));
          pd_error(x,"soundfiler read: resize failed");
        }
        iVar17 = 0;
      }
LAB_00128856:
      binbuf_free(b);
      if (iVar17 == 0) {
        uVar15 = 0;
      }
      else {
        uVar15 = (ulong)iVar17;
        tVar27 = sys_getsr();
        local_898.sf_samplerate = (int)tVar27;
        local_898.sf_headersize = 0;
        local_898.sf_bytespersample = 4;
        local_898._40_8_ = local_898._40_8_ & 0xffffffff00000000;
        local_898.sf_nchannels = uVar25;
      }
    }
  }
LAB_00128085:
  local_898.sf_fd = -1;
LAB_0012808a:
  outlet_soundfileinfo(x->x_out2,&local_898);
  outlet_float((x->x_obj).te_outlet,(float)uVar15);
  return;
}

Assistant:

static void soundfiler_read(t_soundfiler *x, t_symbol *s,
    int argc, t_atom *argv)
{
    t_soundfile sf = {0};
    int fd = -1, resize = 0, ascii = 0, raw = 0, i;
    size_t skipframes = 0, finalsize = 0, maxsize = SFMAXFRAMES,
           framesread = 0, bufframes, j;
    ssize_t nframes, framesinfile;
    char endianness;
    const char *filename;
    t_garray *garrays[MAXSFCHANS];
    t_word *vecs[MAXSFCHANS];
    char sampbuf[SAMPBUFSIZE];

    soundfile_clear(&sf);
    sf.sf_headersize = -1;
    while (argc > 0 && argv->a_type == A_SYMBOL &&
        *argv->a_w.w_symbol->s_name == '-')
    {
        const char *flag = argv->a_w.w_symbol->s_name + 1;
        if (!strcmp(flag, "skip"))
        {
            if (argc < 2 || argv[1].a_type != A_FLOAT ||
                (argv[1].a_w.w_float) < 0)
                    goto usage;
            skipframes = argv[1].a_w.w_float;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(flag, "ascii"))
        {
            if (sf.sf_headersize >= 0)
                post("'-ascii' overridden by '-raw'");
            ascii = 1;
            argc--; argv++;
        }
        else if (!strcmp(flag, "raw"))
        {
            if (ascii)
                post("'-ascii' overridden by '-raw'");
            else if (sf.sf_type)
                post("'-%s' overridden by '-raw'", sf.sf_type->t_name);
            if (argc < 5 ||
                argv[1].a_type != A_FLOAT ||
                ((sf.sf_headersize = argv[1].a_w.w_float) < 0) ||
                argv[2].a_type != A_FLOAT ||
                ((sf.sf_nchannels = argv[2].a_w.w_float) < 1) ||
                (sf.sf_nchannels > MAXSFCHANS) ||
                argv[3].a_type != A_FLOAT ||
                ((sf.sf_bytespersample = argv[3].a_w.w_float) < 2) ||
                    (sf.sf_bytespersample > 4) ||
                argv[4].a_type != A_SYMBOL ||
                    ((endianness = argv[4].a_w.w_symbol->s_name[0]) != 'b'
                    && endianness != 'l' && endianness != 'n'))
                        goto usage;
            if (endianness == 'b')
                sf.sf_bigendian = 1;
            else if (endianness == 'l')
                sf.sf_bigendian = 0;
            else
                sf.sf_bigendian = sys_isbigendian();
            sf.sf_samplerate = sys_getsr();
            sf.sf_bytesperframe = sf.sf_nchannels * sf.sf_bytespersample;
            raw = 1;
            argc -= 5; argv += 5;
        }
        else if (!strcmp(flag, "resize"))
        {
            resize = 1;
            argc -= 1; argv += 1;
        }
        else if (!strcmp(flag, "maxsize"))
        {
            ssize_t tmp;
            if (argc < 2 || argv[1].a_type != A_FLOAT ||
                ((tmp = (argv[1].a_w.w_float > SFMAXFRAMES ?
                SFMAXFRAMES : argv[1].a_w.w_float)) < 0))
                    goto usage;
            maxsize = (size_t)tmp;
            resize = 1;     /* maxsize implies resize */
            argc -= 2; argv += 2;
        }
        else
        {
                /* check for type by name */
            if (!(sf.sf_type = soundfile_findtype(flag)))
                goto usage; /* unknown flag */
            ascii = 0; /* replaced */
            if (sf.sf_headersize >= 0)
                post("'-%s' overridden by '-raw'", sf.sf_type->t_name);
            argc -= 1; argv += 1;
        }
    }
    if (sf.sf_headersize >= 0)
    {
        ascii = 0;
        sf.sf_type = NULL;
    }
    if (argc < 1 ||                           /* no filename or tables */
        argc > MAXSFCHANS + 1 ||              /* too many tables */
        argv[0].a_type != A_SYMBOL)           /* bad filename */
            goto usage;
    filename = argv[0].a_w.w_symbol->s_name;
    argc--; argv++;

        /* check for implicit ascii */
    if (!ascii && !sf.sf_type && sf.sf_headersize < 0)
        ascii = ascii_hasextension(filename, MAXPDSTRING);

    for (i = 0; i < argc; i++)
    {
        int vecsize;
        if (argv[i].a_type != A_SYMBOL)
            goto usage;
        if (!(garrays[i] =
            (t_garray *)pd_findbyclass(argv[i].a_w.w_symbol, garray_class)))
        {
            pd_error(x, "soundfiler read: %s: no such table",
                argv[i].a_w.w_symbol->s_name);
            goto done;
        }
        else if (!garray_getfloatwords(garrays[i], &vecsize,
                &vecs[i]))
            pd_error(x, "soundfiler read: %s: bad template for tabwrite",
                argv[i].a_w.w_symbol->s_name);
        if (finalsize && finalsize != (size_t)vecsize && !resize)
        {
            post("arrays have different lengths, resizing...");
            resize = 1;
        }
        finalsize = vecsize;
    }
    if (ascii)
    {
        t_asciiargs a =
            {skipframes, finalsize, argc, vecs, garrays, resize, maxsize, 0};
        if (!argc)
        {
            pd_error(x, "soundfiler read: "
                        "'-ascii' requires at least one table");
            goto done;
        }
        if ((framesread = soundfiler_readascii(x, filename, &a)) == 0)
            goto done;
            /* fill in for info outlet */
        sf.sf_samplerate = sys_getsr();
        sf.sf_headersize = 0;
        sf.sf_nchannels = argc;
        sf.sf_bytespersample = 4;
        sf.sf_bigendian = sys_isbigendian();
        goto done;
    }

    fd = open_soundfile_via_canvas(x->x_canvas, filename, &sf, skipframes);
    if (fd < 0)
    {
        object_sferror(x, "soundfiler read", filename, errno, &sf);
        goto done;
    }
    framesinfile = sf.sf_bytelimit / sf.sf_bytesperframe;

    if (resize)
    {
            /* figure out what to resize to using header info */
        if ((size_t)framesinfile > maxsize)
        {
            pd_error(x, "soundfiler read: truncated to %ld elements",
                (long)maxsize);
            framesinfile = maxsize;
        }
        finalsize = framesinfile;
        for (i = 0; i < argc; i++)
        {
            int vecsize;
            garray_resize_long(garrays[i], finalsize);
                /* for sanity's sake let's clear the save-in-patch flag here */
            garray_setsaveit(garrays[i], 0);
            if (!garray_getfloatwords(garrays[i], &vecsize, &vecs[i])
                /* if the resize failed, garray_resize reported the error */
                || (vecsize != framesinfile))
            {
                pd_error(x, "soundfiler read: resize failed");
                goto done;
            }
        }
    }

    if (!finalsize) finalsize = SFMAXFRAMES;
    if (framesinfile >= 0 && finalsize > (size_t)framesinfile)
        finalsize = framesinfile;

        /* no tablenames, try to use header info instead of reading */
    if (argc == 0 &&
        !(raw ||                     /* read if raw */
          finalsize == SFMAXFRAMES)) /* read if unknown size */
    {
        framesread = finalsize;
#ifdef DEBUG_SOUNDFILE
    post("skipped reading frames");
#endif
        goto done;
    }

        /* read */
#ifdef DEBUG_SOUNDFILE
    post("reading frames");
#endif
    bufframes = SAMPBUFSIZE / sf.sf_bytesperframe;
    for (framesread = 0; framesread < finalsize;)
    {
        size_t thisread = finalsize - framesread;
        thisread = (thisread > bufframes ? bufframes : thisread);
        nframes = read(sf.sf_fd, sampbuf,
            thisread * sf.sf_bytesperframe) / sf.sf_bytesperframe;
        if (nframes <= 0) break;
        soundfile_xferin_words(&sf, argc, vecs, framesread,
            (unsigned char *)sampbuf, nframes);
        framesread += nframes;
    }
        /* warn if a file's bad size field is gobbling memory */
    if (resize && framesread < (size_t)finalsize)
    {
        post("warning: soundfile %s header promised \
%ld points but file was truncated to %ld",
            filename, (long)finalsize, (long)framesread);
    }
        /* zero out remaining elements of vectors */
    for (i = 0; i < argc; i++)
    {
        int vecsize;
        if (garray_getfloatwords(garrays[i], &vecsize, &vecs[i]))
            for (j = framesread; j < (size_t)vecsize; j++)
                vecs[i][j].w_float = 0;
    }
        /* zero out vectors in excess of number of channels */
    for (i = sf.sf_nchannels; i < argc; i++)
    {
        int vecsize;
        t_word *foo;
        if (garray_getfloatwords(garrays[i], &vecsize, &foo))
            for (j = 0; j < (size_t)vecsize; j++)
                foo[j].w_float = 0;
    }
        /* do all graphics updates */
    for (i = 0; i < argc; i++)
        garray_redraw(garrays[i]);
    goto done;
usage:
    pd_error(x, "usage: read [flags] filename [tablename]...");
    post("flags: -skip <n> -resize -maxsize <n> %s -ascii ...", sf_typeargs);
    post("-raw <headerbytes> <channels> <bytespersample> "
         "<endian (b, l, or n)>");
done:
    sf.sf_fd = -1;
    if (fd >= 0)
        sys_close(fd);
    outlet_soundfileinfo(x->x_out2, &sf);
    outlet_float(x->x_obj.ob_outlet, (t_float)framesread);
}